

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::MeanDamageRatio
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  pointer pmVar1;
  mapped_type *this_00;
  code *pcVar2;
  _Rb_tree_node_base *p_Var3;
  undefined4 in_register_0000000c;
  int in_stack_00000008;
  pair<const_outkey2,_OutLosses> x;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  items;
  float local_8c;
  aggreports *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  undefined8 local_78;
  undefined1 auStack_70 [8];
  undefined4 local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pmVar1 = (this->out_loss_->
           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_88 = this;
  local_80 = fileIDs;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var3 = *(_Base_ptr *)((long)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header + 0x10);
      p_Var3 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    local_68 = *(undefined4 *)&p_Var3[1]._M_left;
    local_78 = *(undefined8 *)(p_Var3 + 1);
    auStack_70 = (undefined1  [8])p_Var3[1]._M_parent;
    this_00 = std::
              map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
              ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                            *)&local_60,(key_type *)&local_78);
    pcVar2 = (code *)GetOutLoss;
    if ((GetOutLoss & 1) != 0) {
      pcVar2 = *(code **)(*(long *)(auStack_70 + CONCAT44(in_register_0000000c,epcalc) + 4) + -1 +
                         GetOutLoss);
    }
    local_8c = (float)(*pcVar2)(auStack_70 + CONCAT44(in_register_0000000c,epcalc) + 4);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_00,&local_8c);
  }
  WriteExceedanceProbabilityTable
            (local_88,local_80,
             (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
              *)&local_60,(double)local_88->totalperiods_,eptype,eptype_tvar,in_stack_00000008,1);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void aggreports::MeanDamageRatio(const std::vector<int> &fileIDs,
				 OASIS_FLOAT (OutLosses::*GetOutLoss)(),
				 const int epcalc, const int eptype,
				 const int eptype_tvar) {

  std::map<int, lossvec> items;

  for (auto x : (*out_loss_)[MEANS]) {
    items[x.first.summary_id].push_back((x.second.*GetOutLoss)());
  }

  WriteExceedanceProbabilityTable(fileIDs, items, totalperiods_, epcalc,
				  eptype, eptype_tvar);

}